

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void __thiscall
Js::JavascriptNativeIntArray::JavascriptNativeIntArray
          (JavascriptNativeIntArray *this,DynamicType *type,uint32 size)

{
  SparseArraySegmentBase *pSVar1;
  SparseArraySegmentBase **ppSVar2;
  SparseArraySegment<int> *this_00;
  uint32 size_local;
  DynamicType *type_local;
  JavascriptNativeIntArray *this_local;
  
  JavascriptNativeArray::JavascriptNativeArray(&this->super_JavascriptNativeArray,type);
  (this->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.super_DynamicObject.
  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject =
       (IRecyclerVisitedObject)&PTR_Finalize_01e01dd0;
  pSVar1 = &Js::JavascriptArray::
            DetermineInlineHeadSegmentPointer<Js::JavascriptNativeIntArray,0u,false>(this)->
            super_SparseArraySegmentBase;
  Js::JavascriptArray::SetHeadAndLastUsedSegment((JavascriptArray *)this,pSVar1);
  pSVar1 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->
                     (&(this->super_JavascriptNativeArray).super_JavascriptArray.head);
  pSVar1->size = size;
  pSVar1 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->
                     (&(this->super_JavascriptNativeArray).super_JavascriptArray.head);
  SparseArraySegmentBase::CheckLengthvsSize(pSVar1);
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                      ((WriteBarrierPtr *)
                       &(this->super_JavascriptNativeArray).super_JavascriptArray.head);
  this_00 = SparseArraySegment<int>::From(*ppSVar2);
  SparseArraySegment<int>::FillSegmentBuffer(this_00,0,size);
  return;
}

Assistant:

JavascriptNativeIntArray::JavascriptNativeIntArray(DynamicType * type, uint32 size)
        : JavascriptNativeArray(type)
    {
        SetHeadAndLastUsedSegment(DetermineInlineHeadSegmentPointer<JavascriptNativeIntArray, 0, false>(this));
        head->size = size;
        head->CheckLengthvsSize();
        SparseArraySegment<int32>::From(head)->FillSegmentBuffer(0, size);
    }